

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O1

string * __thiscall
duckdb::StructStats::ToString_abi_cxx11_
          (string *__return_storage_ptr__,StructStats *this,BaseStatistics *stats)

{
  undefined8 *puVar1;
  pointer pcVar2;
  child_list_t<LogicalType> *this_00;
  const_reference pvVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  size_type __n;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  string local_78;
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  StructStats *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_38 = this;
  this_00 = StructType::GetChildTypes_abi_cxx11_((LogicalType *)this);
  if ((this_00->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 0;
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pvVar3 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[](this_00,__n);
      pcVar2 = (pvVar3->first)._M_dataplus._M_p;
      local_58 = local_48;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + (pvVar3->first)._M_string_length);
      ::std::__cxx11::string::append((char *)&local_58);
      BaseStatistics::ToString_abi_cxx11_
                (&local_78,(BaseStatistics *)(*(long *)(local_38 + 0x50) + lVar7));
      uVar5 = 0xf;
      if (local_58 != local_48) {
        uVar5 = local_48[0];
      }
      if (uVar5 < local_78._M_string_length + local_50) {
        uVar6 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          uVar6 = local_78.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar6 < local_78._M_string_length + local_50) goto LAB_01791d1e;
        puVar4 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
      }
      else {
LAB_01791d1e:
        puVar4 = (undefined8 *)
                 ::std::__cxx11::string::_M_append
                           ((char *)&local_58,(ulong)local_78._M_dataplus._M_p);
      }
      local_98 = &local_88;
      puVar1 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar1) {
        local_88 = *puVar1;
        uStack_80 = puVar4[3];
      }
      else {
        local_88 = *puVar1;
        local_98 = (undefined8 *)*puVar4;
      }
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      __n = __n + 1;
      lVar7 = lVar7 + 0x58;
    } while (__n < (ulong)(((long)(this_00->
                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ).
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->
                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ).
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x6db6db6db6db6db7));
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string StructStats::ToString(const BaseStatistics &stats) {
	string result;
	result += " {";
	auto &child_types = StructType::GetChildTypes(stats.GetType());
	for (idx_t i = 0; i < child_types.size(); i++) {
		if (i > 0) {
			result += ", ";
		}
		result += child_types[i].first + ": " + stats.child_stats[i].ToString();
	}
	result += "}";
	return result;
}